

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.h
# Opt level: O2

uchar __thiscall
gpu::LuminousFilters<unsigned_char>::contrast
          (LuminousFilters<unsigned_char> *this,uchar *pixel,float cValue)

{
  int iVar1;
  uchar uVar2;
  int iVar3;
  float fVar4;
  
  fVar4 = (float)(~-(uint)(1.0 < cValue) & (uint)cValue |
                 (uint)((cValue + -1.0) * 0.5 + 1.0) & -(uint)(1.0 < cValue));
  iVar3 = (int)((128.0 - fVar4 * 128.0) + (float)*pixel * fVar4);
  iVar1 = 0;
  if (0 < iVar3) {
    iVar1 = iVar3;
  }
  uVar2 = (uchar)iVar1;
  if (0xfe < iVar1) {
    uVar2 = 0xff;
  }
  return uVar2;
}

Assistant:

FUNCTION_PREFIX T LuminousFilters<T>::contrast(const T& pixel, float cValue)
    {
      if(cValue > 1)
      {
        float diff = cValue - 1;
        cValue = 1 + diff/2;
      }
      int val = (int)((float)pixel*cValue + (-cValue*SIGNED_CHAR_MAX + SIGNED_CHAR_MAX));   
      PIXEL_DOMAIN_CHECK(val);
      return val;
    }